

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

int __thiscall
pybind11::detail::process_attribute<pybind11::arg,_void>::init
          (process_attribute<pybind11::arg,_void> *this,EVP_PKEY_CTX *ctx)

{
  function_record *__args;
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *pvVar3;
  bool local_42;
  bool local_41;
  handle local_40;
  void *local_38;
  bool local_2a;
  bool local_29;
  handle local_28;
  void *local_20;
  function_record *local_18;
  function_record *r_local;
  arg *a_local;
  ulong uVar4;
  
  local_18 = (function_record *)ctx;
  r_local = (function_record *)this;
  if (((*(ushort *)(ctx + 0x59) >> 4 & 1) != 0) &&
     (bVar1 = std::
              vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ::empty((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       *)(ctx + 0x18)), bVar1)) {
    pvVar3 = &local_18->args;
    local_20 = (void *)0x0;
    memset(&local_28,0,8);
    handle::handle(&local_28);
    local_29 = true;
    local_2a = false;
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const(&)[5],decltype(nullptr),pybind11::handle,bool,bool>
              ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
                *)pvVar3,(char (*) [5])"self",&local_20,&local_28,&local_29,&local_2a);
  }
  __args = r_local;
  pvVar3 = &local_18->args;
  local_38 = (void *)0x0;
  memset(&local_40,0,8);
  handle::handle(&local_40);
  local_41 = (bool)((*(byte *)&r_local->doc & 1 ^ 0xff) & 1);
  local_42 = (bool)(*(byte *)&r_local->doc >> 1 & 1);
  std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>::
  emplace_back<char_const*const&,decltype(nullptr),pybind11::handle,bool,bool_const&>
            ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
              *)pvVar3,&__args->name,&local_38,&local_40,&local_41,&local_42);
  uVar4 = CONCAT62((int6)((ulong)local_18 >> 0x10),*(ushort *)&local_18->field_0x59 >> 7) &
          0xffffffffffff0001;
  iVar2 = (int)uVar4;
  if ((short)uVar4 != 0) {
    process_kw_only_arg((arg *)r_local,local_18);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

static void init(const arg &a, function_record *r) {
        if (r->is_method && r->args.empty())
            r->args.emplace_back("self", nullptr, handle(), true /*convert*/, false /*none not allowed*/);
        r->args.emplace_back(a.name, nullptr, handle(), !a.flag_noconvert, a.flag_none);

        if (r->has_kw_only_args) process_kw_only_arg(a, r);
    }